

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

cali_variant_t cali_get(cali_id_t attr_id)

{
  bool bVar1;
  uint64_t uVar2;
  anon_union_8_7_33918203_for_value aVar3;
  cali_variant_t cVar4;
  Caliper c;
  Attribute local_50;
  Caliper local_48;
  Entry local_28;
  
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool(&local_48);
  uVar2 = 0;
  aVar3.v_uint = 0;
  if (bVar1) {
    local_50 = cali::Caliper::get_attribute(&local_48,attr_id);
    cali::Caliper::get(&local_28,&local_48,&local_50);
    uVar2 = local_28.m_value.m_v.type_and_size;
    aVar3 = local_28.m_value.m_v.value;
  }
  cVar4.value.v_uint = aVar3.v_uint;
  cVar4.type_and_size = uVar2;
  return cVar4;
}

Assistant:

cali_variant_t cali_get(cali_id_t attr_id)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return cali_make_empty_variant();

    return c.get(c.get_attribute(attr_id)).value().c_variant();
}